

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_simd.h
# Opt level: O0

void dctInverse8x8_avx_7(float *data)

{
  undefined1 auVar1 [32];
  float fVar2;
  float fVar3;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  float *data_local;
  
  auVar13._16_16_ = *(undefined1 (*) [16])(data + 8);
  auVar13._0_16_ = *(undefined1 (*) [16])data;
  auVar14._16_16_ = *(undefined1 (*) [16])(data + 0xc);
  auVar14._0_16_ = *(undefined1 (*) [16])(data + 4);
  auVar5 = vunpcklpd_avx(auVar13,auVar14);
  auVar13 = vunpckhpd_avx(auVar13,auVar14);
  auVar14 = vunpcklps_avx(auVar5,auVar13);
  auVar13 = vunpckhps_avx(auVar5,auVar13);
  auVar5 = vunpcklpd_avx(auVar14,auVar13);
  auVar13 = vunpckhpd_avx(auVar14,auVar13);
  auVar14 = vpermilps_avx(auVar5,0);
  auVar1 = vpermilps_avx(auVar5,0x55);
  auVar12 = vpermilps_avx(auVar5,0xaa);
  auVar5 = vpermilps_avx(auVar5,0xff);
  fVar9 = sAvxCoef[0];
  fVar10 = sAvxCoef[1];
  fVar11 = sAvxCoef[2];
  auVar4._0_4_ = fVar9 * auVar14._0_4_ + auVar1._0_4_ * 0.4619398 +
                 auVar12._0_4_ * 0.3535536 + auVar5._0_4_ * 0.1913422;
  auVar4._4_4_ = fVar10 * auVar14._4_4_ + auVar1._4_4_ * 0.1913422 +
                 auVar12._4_4_ * -0.3535536 + auVar5._4_4_ * -0.4619398;
  auVar4._8_4_ = fVar11 * auVar14._8_4_ + auVar1._8_4_ * -0.1913422 +
                 auVar12._8_4_ * -0.3535536 + auVar5._8_4_ * 0.4619398;
  auVar4._12_4_ =
       sAvxCoef[3] * auVar14._12_4_ + auVar1._12_4_ * -0.4619398 +
       auVar12._12_4_ * 0.3535536 + auVar5._12_4_ * -0.1913422;
  auVar4._16_4_ =
       fVar9 * auVar14._16_4_ + auVar1._16_4_ * 0.4619398 +
       auVar12._16_4_ * 0.3535536 + auVar5._16_4_ * 0.1913422;
  auVar4._20_4_ =
       fVar10 * auVar14._20_4_ + auVar1._20_4_ * 0.1913422 +
       auVar12._20_4_ * -0.3535536 + auVar5._20_4_ * -0.4619398;
  auVar4._24_4_ =
       fVar11 * auVar14._24_4_ + auVar1._24_4_ * -0.1913422 +
       auVar12._24_4_ * -0.3535536 + auVar5._24_4_ * 0.4619398;
  auVar4._28_4_ = auVar14._28_4_ + auVar1._28_4_ + auVar12._28_4_ + auVar5._28_4_;
  auVar5 = vpermilps_avx(auVar13,0);
  auVar14 = vpermilps_avx(auVar13,0x55);
  auVar1 = vpermilps_avx(auVar13,0xaa);
  auVar13 = vpermilps_avx(auVar13,0xff);
  auVar12._0_4_ =
       auVar5._0_4_ * 0.4903927 + auVar14._0_4_ * 0.4157349 +
       auVar1._0_4_ * 0.2777855 + auVar13._0_4_ * 0.09754573;
  auVar12._4_4_ =
       auVar5._4_4_ * 0.4157349 + auVar14._4_4_ * -0.09754573 +
       auVar1._4_4_ * -0.4903927 + auVar13._4_4_ * -0.2777855;
  auVar12._8_4_ =
       auVar5._8_4_ * 0.2777855 + auVar14._8_4_ * -0.4903927 +
       auVar1._8_4_ * 0.09754573 + auVar13._8_4_ * 0.4157349;
  auVar12._12_4_ =
       auVar5._12_4_ * 0.09754573 + auVar14._12_4_ * -0.2777855 +
       auVar1._12_4_ * 0.4157349 + auVar13._12_4_ * -0.4903927;
  auVar12._16_4_ =
       auVar5._16_4_ * 0.4903927 + auVar14._16_4_ * 0.4157349 +
       auVar1._16_4_ * 0.2777855 + auVar13._16_4_ * 0.09754573;
  auVar12._20_4_ =
       auVar5._20_4_ * 0.4157349 + auVar14._20_4_ * -0.09754573 +
       auVar1._20_4_ * -0.4903927 + auVar13._20_4_ * -0.2777855;
  auVar12._24_4_ =
       auVar5._24_4_ * 0.2777855 + auVar14._24_4_ * -0.4903927 +
       auVar1._24_4_ * 0.09754573 + auVar13._24_4_ * 0.4157349;
  auVar12._28_4_ = auVar5._28_4_ + auVar14._28_4_ + auVar1._28_4_ + auVar13._28_4_;
  auVar13 = vsubps_avx(auVar4,auVar12);
  auVar5._0_4_ = auVar4._0_4_ + auVar12._0_4_;
  auVar5._4_4_ = auVar4._4_4_ + auVar12._4_4_;
  auVar5._8_4_ = auVar4._8_4_ + auVar12._8_4_;
  auVar5._12_4_ = auVar4._12_4_ + auVar12._12_4_;
  auVar5._16_4_ = auVar4._16_4_ + auVar12._16_4_;
  auVar5._20_4_ = auVar4._20_4_ + auVar12._20_4_;
  auVar5._24_4_ = auVar4._24_4_ + auVar12._24_4_;
  auVar5._28_4_ = auVar4._28_4_ + auVar12._28_4_;
  auVar13 = vpermilps_avx(auVar13,0x1b);
  auVar13 = vperm2f128_avx(auVar13,auVar5,2);
  fVar3 = auVar13._0_4_ * fVar9;
  fVar6 = auVar13._4_4_ * fVar10;
  fVar7 = auVar13._8_4_ * fVar11;
  fVar8 = auVar13._12_4_ * sAvxCoef[3];
  fVar9 = auVar13._16_4_ * fVar9;
  fVar10 = auVar13._20_4_ * fVar10;
  fVar2 = auVar13._28_4_;
  fVar11 = auVar13._24_4_ * fVar11;
  *data = fVar3;
  data[1] = fVar6;
  data[2] = fVar7;
  data[3] = fVar8;
  data[4] = fVar9;
  data[5] = fVar10;
  data[6] = fVar11;
  data[7] = fVar2;
  data[8] = fVar3;
  data[9] = fVar6;
  data[10] = fVar7;
  data[0xb] = fVar8;
  data[0xc] = fVar9;
  data[0xd] = fVar10;
  data[0xe] = fVar11;
  data[0xf] = fVar2;
  data[0x10] = fVar3;
  data[0x11] = fVar6;
  data[0x12] = fVar7;
  data[0x13] = fVar8;
  data[0x14] = fVar9;
  data[0x15] = fVar10;
  data[0x16] = fVar11;
  data[0x17] = fVar2;
  data[0x18] = fVar3;
  data[0x19] = fVar6;
  data[0x1a] = fVar7;
  data[0x1b] = fVar8;
  data[0x1c] = fVar9;
  data[0x1d] = fVar10;
  data[0x1e] = fVar11;
  data[0x1f] = fVar2;
  data[0x20] = fVar3;
  data[0x21] = fVar6;
  data[0x22] = fVar7;
  data[0x23] = fVar8;
  data[0x24] = fVar9;
  data[0x25] = fVar10;
  data[0x26] = fVar11;
  data[0x27] = fVar2;
  data[0x28] = fVar3;
  data[0x29] = fVar6;
  data[0x2a] = fVar7;
  data[0x2b] = fVar8;
  data[0x2c] = fVar9;
  data[0x2d] = fVar10;
  data[0x2e] = fVar11;
  data[0x2f] = fVar2;
  data[0x30] = fVar3;
  data[0x31] = fVar6;
  data[0x32] = fVar7;
  data[0x33] = fVar8;
  data[0x34] = fVar9;
  data[0x35] = fVar10;
  data[0x36] = fVar11;
  data[0x37] = fVar2;
  data[0x38] = fVar3;
  data[0x39] = fVar6;
  data[0x3a] = fVar7;
  data[0x3b] = fVar8;
  data[0x3c] = fVar9;
  data[0x3d] = fVar10;
  data[0x3e] = fVar11;
  data[0x3f] = fVar2;
  return;
}

Assistant:

static void
dctInverse8x8_avx_7 (float* data)
{
#ifdef IMF_HAVE_GCC_INLINEASM_X86_64
    // clang-format off
    __asm__(

        /* ==============================================
         *                Row 1D DCT
         * ----------------------------------------------
         */
        IDCT_AVX_SETUP_2_ROWS (0, 4, 14, 15, 0, 16, 32, 48)

            "vbroadcastf128   (%1),  %%ymm8         \n"
            "vbroadcastf128 16(%1),  %%ymm9         \n"
            "vbroadcastf128 32(%1), %%ymm10         \n"
            "vbroadcastf128 48(%1), %%ymm11         \n"

            /* Stash a vector of [a a a a | a a a a] away  in ymm2 */
            "vinsertf128 $1,  %%xmm8,  %%ymm8,  %%ymm2 \n"

        IDCT_AVX_MMULT_ROWS (0)

            "vbroadcastf128  64(%1),  %%ymm8         \n"
            "vbroadcastf128  80(%1),  %%ymm9         \n"
            "vbroadcastf128  96(%1), %%ymm10         \n"
            "vbroadcastf128 112(%1), %%ymm11         \n"

        IDCT_AVX_MMULT_ROWS (4)

        IDCT_AVX_EO_TO_ROW_HALVES (0, 4, 0, 12)

        "vperm2f128 $0x02, %%ymm0, %%ymm12, %%ymm0   \n"

        /* ==============================================
         *                Column 1D DCT
         * ----------------------------------------------
         */

        /* DC only, so multiple by a and we're done */
        "vmulps   %%ymm2, %%ymm0, %%ymm0  \n"

        /* Copy out results  */
        "vmovaps %%ymm0,    (%0)          \n"
        "vmovaps %%ymm0,  32(%0)          \n"
        "vmovaps %%ymm0,  64(%0)          \n"
        "vmovaps %%ymm0,  96(%0)          \n"
        "vmovaps %%ymm0, 128(%0)          \n"
        "vmovaps %%ymm0, 160(%0)          \n"
        "vmovaps %%ymm0, 192(%0)          \n"
        "vmovaps %%ymm0, 224(%0)          \n"

#    ifndef __AVX__
        "vzeroupper                   \n"
#    endif /* __AVX__ */
        IDCT_AVX_OIC (data));
    // clang-format on
#else
    dctInverse8x8_scalar_7 (data);
#endif
}